

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O3

void __thiscall ImBoolVector::Resize(ImBoolVector *this,int sz)

{
  void *__dest;
  int iVar1;
  int iVar2;
  
  iVar1 = sz + 0x1f >> 5;
  iVar2 = *(int *)(this + 4);
  if (iVar2 < iVar1) {
    if (iVar2 == 0) {
      iVar2 = 8;
    }
    else {
      iVar2 = iVar2 / 2 + iVar2;
    }
    if (iVar2 <= iVar1) {
      iVar2 = iVar1;
    }
    __dest = ImGui::MemAlloc((long)iVar2 << 2);
    if (*(void **)(this + 8) != (void *)0x0) {
      memcpy(__dest,*(void **)(this + 8),(long)*(int *)this << 2);
      ImGui::MemFree(*(void **)(this + 8));
    }
    *(void **)(this + 8) = __dest;
    *(int *)(this + 4) = iVar2;
  }
  else {
    __dest = *(void **)(this + 8);
  }
  *(int *)this = iVar1;
  memset(__dest,0,(long)iVar1 << 2);
  return;
}

Assistant:

void            Resize(int sz)          { Storage.resize((sz + 31) >> 5); memset(Storage.Data, 0, (size_t)Storage.Size * sizeof(Storage.Data[0])); }